

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O1

void CMU462::Misc::draw_sphere_opengl(Vector3D *p,double r,Color *c)

{
  char cVar1;
  
  cVar1 = glIsEnabled(0xb50);
  if (cVar1 != '\0') {
    glDisable(0xb50);
    glColor3fv(c);
    draw_sphere(p,r);
    glEnable(0xb50);
    return;
  }
  glColor3fv(c);
  draw_sphere(p,r);
  return;
}

Assistant:

void draw_sphere_opengl(const Vector3D& p, double r, const Color& c) {
  if (glIsEnabled(GL_LIGHTING)) {
    glDisable(GL_LIGHTING);
    glColor3fv(&c.r);
    draw_sphere(p, r);
    glEnable(GL_LIGHTING);
  } else {
    glColor3fv(&c.r);
    draw_sphere(p, r);
  }
}